

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_to_base64(wally_psbt *psbt,uint32_t flags,char **output)

{
  int iVar1;
  uchar *bytes_out;
  size_t len;
  size_t written;
  size_t local_38;
  size_t local_30;
  
  iVar1 = -2;
  if (((output != (char **)0x0) && (*output = (char *)0x0, psbt != (wally_psbt *)0x0)) &&
     (iVar1 = wally_psbt_to_bytes(psbt,flags,(uchar *)0x0,0,&local_38), iVar1 == 0)) {
    bytes_out = (uchar *)wally_malloc(local_38);
    if (bytes_out == (uchar *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = wally_psbt_to_bytes(psbt,flags,bytes_out,local_38,&local_30);
      if ((iVar1 == 0) && (iVar1 = -1, local_30 == local_38)) {
        iVar1 = wally_base64_from_bytes(bytes_out,local_38,0,output);
      }
      clear_and_free(bytes_out,local_38);
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_to_base64(const struct wally_psbt *psbt, uint32_t flags, char **output)
{
    unsigned char *buff;
    size_t len, written;
    int ret = WALLY_OK;

    TX_CHECK_OUTPUT;
    if (!psbt)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_get_length(psbt, flags, &len)) != WALLY_OK)
        return ret;

    if ((buff = wally_malloc(len)) == NULL)
        return WALLY_ENOMEM;

    /* Get psbt bytes */
    if ((ret = wally_psbt_to_bytes(psbt, flags, buff, len, &written)) != WALLY_OK)
        goto done;

    if (written != len) {
        ret = WALLY_ERROR; /* Length calculated incorrectly */
        goto done;
    }

    /* Base64 encode */
    ret = wally_base64_from_bytes(buff, len, 0, output);

done:
    clear_and_free(buff, len);
    return ret;
}